

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

MemPage * btreePageLookup(BtShared *pBt,Pgno pgno)

{
  DbPage *pDbPage_00;
  DbPage *pDbPage;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  pDbPage_00 = sqlite3PagerLookup(pBt->pPager,pgno);
  if (pDbPage_00 == (DbPage *)0x0) {
    pBt_local = (BtShared *)0x0;
  }
  else {
    pBt_local = (BtShared *)btreePageFromDbPage(pDbPage_00,pgno,pBt);
  }
  return (MemPage *)pBt_local;
}

Assistant:

static MemPage *btreePageLookup(BtShared *pBt, Pgno pgno){
  DbPage *pDbPage;
  assert( sqlite3_mutex_held(pBt->mutex) );
  pDbPage = sqlite3PagerLookup(pBt->pPager, pgno);
  if( pDbPage ){
    return btreePageFromDbPage(pDbPage, pgno, pBt);
  }
  return 0;
}